

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  TokenType TVar1;
  long *local_78 [2];
  long local_68 [2];
  Token local_58;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_58,this);
    if (5 < local_58.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,local_58.field_2.text_._M_str,
               local_58.field_2.text_._M_str + local_58.field_2.text_._M_len);
    std::__cxx11::string::operator=((string *)out_label,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = std::string(Consume().text());
  } else {
    out_label->clear();
  }
  return Result::Ok;
}